

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::namespace_uri(xml_attribute attr,xml_node parent)

{
  namespace_uri_predicate pred_00;
  char_t *pcVar1;
  unspecified_bool_type p_Var2;
  unspecified_bool_type p_Var3;
  xml_attribute local_40;
  xml_attribute a;
  xml_node p;
  namespace_uri_predicate pred;
  xml_node parent_local;
  xml_attribute attr_local;
  
  parent_local._root = (xml_node_struct *)attr._attr;
  pcVar1 = xml_attribute::name((xml_attribute *)&parent_local);
  namespace_uri_predicate::namespace_uri_predicate((namespace_uri_predicate *)&p,pcVar1);
  a._attr = (xml_attribute_struct *)parent._root;
  if (p._root != (xml_node_struct *)0x0) {
    while (p_Var2 = xml_node::operator_cast_to_function_pointer((xml_node *)&a),
          p_Var2 != (unspecified_bool_type)0x0) {
      pred_00.prefix_length = (size_t)pred.prefix;
      pred_00.prefix = (char_t *)p._root;
      local_40 = xml_node::
                 find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                           ((xml_node *)&a,pred_00);
      p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_40);
      if (p_Var3 != (unspecified_bool_type)0x0) {
        pcVar1 = xml_attribute::value(&local_40);
        return pcVar1;
      }
      a._attr = (xml_attribute_struct *)xml_node::parent((xml_node *)&a);
    }
  }
  attr_local._attr = (xml_attribute_struct *)0x354af5;
  return (char_t *)attr_local._attr;
}

Assistant:

PUGI__FN const char_t* namespace_uri(xml_attribute attr, xml_node parent)
	{
		namespace_uri_predicate pred = attr.name();

		// Default namespace does not apply to attributes
		if (!pred.prefix) return PUGIXML_TEXT("");

		xml_node p = parent;

		while (p)
		{
			xml_attribute a = p.find_attribute(pred);

			if (a) return a.value();

			p = p.parent();
		}

		return PUGIXML_TEXT("");
	}